

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Index __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>::
New<wabt::interp::Module*>
          (FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
           *this,Module **args)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  size_type sVar3;
  size_type sVar4;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> local_50;
  reference local_48;
  reference local_38;
  FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
  *local_28;
  Index index;
  Module **args_local;
  FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
  *this_local;
  
  index = (Index)args;
  args_local = (Module **)this;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18));
  if (bVar1) {
    sVar3 = std::
            vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
            ::size((vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                    *)this);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)(this + 0x30));
    if (sVar3 != sVar4) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Module *>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),false);
    std::
    vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
    ::emplace_back<wabt::interp::Module*>
              ((vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
                *)this,(Module **)index);
    sVar3 = std::
            vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
            ::size((vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                    *)this);
    this_local = (FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                  *)(sVar3 - 1);
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18));
    local_28 = (FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                *)*pvVar2;
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),(size_type)local_28);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (!bVar1) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Module *>]"
                   );
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18));
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),(size_type)local_28);
    std::_Bit_reference::operator=(&local_48,false);
    std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>::
    unique_ptr<std::default_delete<wabt::interp::Object>,void>
              ((unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>> *)
               &local_50,*(pointer *)index);
    this_00 = std::
              vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
              ::operator[]((vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                            *)this,(size_type)local_28);
    std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::operator=
              (this_00,&local_50);
    std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::~unique_ptr
              (&local_50);
    this_local = local_28;
  }
  return (Index)this_local;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}